

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

void __thiscall QtMWidgets::MsgBoxTitle::paintEvent(MsgBoxTitle *this,QPaintEvent *param_1)

{
  int iVar1;
  long lVar2;
  MsgBoxTitlePrivate *pMVar3;
  ColorGroup CVar4;
  QPainter p;
  undefined1 auStack_48 [32];
  QString local_28;
  double local_10;
  
  QPainter::QPainter((QPainter *)auStack_48,(QPaintDevice *)&this->field_0x10);
  CVar4 = QWidget::palette();
  QPalette::brush(CVar4,Dark);
  QPainter::setPen((QColor *)auStack_48);
  lVar2 = *(long *)&this->field_0x20;
  pMVar3 = (this->d).d;
  iVar1 = pMVar3->margin;
  local_28.d.d = (Data *)(double)iVar1;
  local_28.d.ptr = (char16_t *)0x0;
  local_28.d.size =
       (qsizetype)(double)((*(int *)(lVar2 + 0x1c) - (iVar1 * 2 + *(int *)(lVar2 + 0x14))) + 1);
  local_10 = (double)((*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1);
  QTextOption::QTextOption((QTextOption *)(auStack_48 + 8),0x81);
  QPainter::drawText((QRectF *)auStack_48,&local_28,(QTextOption *)&pMVar3->preparedTitle);
  QTextOption::~QTextOption((QTextOption *)(auStack_48 + 8));
  QPainter::~QPainter((QPainter *)auStack_48);
  return;
}

Assistant:

void paintEvent( QPaintEvent * ) override
	{
		QPainter p( this );

		p.setPen( palette().color( QPalette::WindowText ) );

		p.drawText( rect().marginsRemoved( QMargins( d->margin, 0,
				d->margin, 0 ) ),
			d->preparedTitle, QTextOption( Qt::AlignLeft | Qt::AlignVCenter ) );
	}